

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

ulong tidyOptGetInt(TidyDoc tdoc,TidyOptionId optId)

{
  TidyDoc p_Var1;
  
  if (tdoc != (TidyDoc)0x0) {
    p_Var1 = tdoc + (ulong)optId * 2 + 0x1c;
    if (optId == TidyDoctype) {
      p_Var1 = tdoc + 0x38;
    }
    return *(ulong *)p_Var1;
  }
  return 0;
}

Assistant:

ulong TIDY_CALL        tidyOptGetInt( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ulong opti = 0;
    if ( impl )
    {
        /* Special case for TidyDoctype, because it has a picklist */
        if ( optId == TidyDoctype )
            opti = cfg( impl, TidyDoctypeMode);
        else
            opti = cfg( impl, optId );
    }
    return opti;
}